

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

Value * system_function_number(Value *context_value,TupleValue *parameter_values)

{
  Value *pVVar1;
  long val;
  longdouble in_ST0;
  double dVar2;
  double dVar3;
  
  if (parameter_values->length == 0) {
    pVVar1 = new_null_value();
    return pVVar1;
  }
  pVVar1 = *parameter_values->items;
  if (pVVar1->value_type - ValueTypeIntegerValue < 2) {
    pVVar1 = copy_value(pVVar1);
    return pVVar1;
  }
  if (pVVar1->value_type == ValueTypeStringValue) {
    strtold(*(char **)(pVVar1 + 1),(char **)0x0);
    dVar2 = ceil((double)in_ST0);
    dVar3 = floor((double)in_ST0);
    if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
      pVVar1 = new_float_value(in_ST0);
      return pVVar1;
    }
    val = (long)ROUND(in_ST0);
  }
  else {
    val = convert_to_integer(pVVar1);
  }
  pVVar1 = new_integer_value(val);
  return pVVar1;
}

Assistant:

Value *system_function_number(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length == 0) return new_null_value();

  Value *value = parameter_values->items[0];

  if (value->value_type == ValueTypeIntegerValue || value->value_type == ValueTypeFloatValue) {
    return copy_value(value);
  }
  else if (value->value_type == ValueTypeStringValue) {
    long double float_value = strtold(((StringValue *) value)->string_value, NULL);

    if (ceil(float_value) == floor(float_value)) {
      return new_integer_value((long long int) float_value);
    }
    else {
      return new_float_value(float_value);
    }
  }

  return new_integer_value(convert_to_integer(value));
}